

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::ThreadData::handle_pending_put(ThreadData *this,size_t i_pending_put_index)

{
  reentrant_put_transaction<void> *this_00;
  long *plVar1;
  long lVar2;
  long lVar3;
  result_type_conflict rVar4;
  param_type local_30;
  
  this_00 = (reentrant_put_transaction<void> *)
            (*(long *)(this + 0x13f0) + i_pending_put_index * 0x28);
  lVar2 = *(long *)(this_00 + 0x20);
  local_30._M_a = 0;
  local_30._M_b = 1;
  rVar4 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_30,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)(this + 0x50),&local_30);
  if (rVar4 == 0) {
    density::
    sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::commit(this_00);
    lVar3 = *(long *)(this + 0x20);
    plVar1 = (long *)(lVar3 + lVar2 * 0x10);
    *plVar1 = *plVar1 + 1;
    plVar1 = (long *)(lVar3 + 8 + lVar2 * 0x10);
    *plVar1 = *plVar1 + 1;
    *(long *)(this + 0x13e0) = *(long *)(this + 0x13e0) + 1;
  }
  else {
    density::
    sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::cancel(this_00);
  }
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData::ReentrantPut>_>
  ::_M_erase((vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData::ReentrantPut>_>
              *)(this + 0x13f0),
             (ReentrantPut *)(i_pending_put_index * 0x28 + *(long *)(this + 0x13f0)));
  return;
}

Assistant:

void handle_pending_put(size_t const i_pending_put_index)
            {
                // commit or cancel a reentrant put
                auto &     pending_put = m_pending_reentrant_puts[i_pending_put_index];
                auto const type_index  = pending_put.m_type_index;
                if (m_random.get_bool())
                {
                    pending_put.m_transaction.commit();
                    m_final_stats.m_counters[type_index].m_existing++;
                    m_final_stats.m_counters[type_index].m_spawned++;
                    m_put_committed++;
                }
                else
                {
                    pending_put.m_transaction.cancel();
                }

                m_pending_reentrant_puts.erase(
                  m_pending_reentrant_puts.begin() + i_pending_put_index);
            }